

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures::RunImpl
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_c8 [8];
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper fixtureHelper
  ;
  bool ctorOk;
  TestDeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailures *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper::
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper *
             )local_c8,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper>
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper *
             )local_c8,&(this->super_Test).m_details);
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper::
  ~DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper *
             )local_c8);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetailsForMultipleFailures)
{
    char const* failure1 = "failure 1";
    char const* failure2 = "failure 2";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure1);
    reporter.ReportFailure(details, failure2);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK_EQUAL(2, (int)result.failures.size());
    CHECK_EQUAL(failure1, result.failures[0].second);
    CHECK_EQUAL(failure2, result.failures[1].second);
}